

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O1

void loadFunction(LoadState *S,Proto *f)

{
  TString *pTVar1;
  lu_byte lVar2;
  byte bVar3;
  uint uVar4;
  size_t sVar5;
  Instruction *pIVar6;
  TValue *pTVar7;
  lu_byte *plVar8;
  Upvaldesc *pUVar9;
  Proto **ppPVar10;
  Proto *pPVar11;
  ls_byte *plVar12;
  AbsLineInfo *pAVar13;
  LocVar *pLVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  lua_Integer paddingContent;
  undefined8 local_38;
  
  sVar5 = loadVarint(S,0x7fffffff);
  f->linedefined = (int)sVar5;
  sVar5 = loadVarint(S,0x7fffffff);
  f->lastlinedefined = (int)sVar5;
  lVar2 = loadByte(S);
  f->numparams = lVar2;
  bVar3 = loadByte(S);
  f->flag = bVar3 & 1;
  if (S->fixed != '\0') {
    f->flag = bVar3 & 1 | 2;
  }
  lVar2 = loadByte(S);
  f->maxstacksize = lVar2;
  sVar5 = loadVarint(S,0x7fffffff);
  uVar4 = (uint)S->offset & 3;
  if (uVar4 != 0) {
    loadBlock(S,&local_38,(ulong)(4 - uVar4));
  }
  iVar17 = (int)sVar5;
  if (S->fixed == '\0') {
    pIVar6 = (Instruction *)luaM_malloc_(S->L,(long)iVar17 << 2,0);
    f->code = pIVar6;
    f->sizecode = iVar17;
    loadBlock(S,pIVar6,(long)iVar17 << 2);
  }
  else {
    pIVar6 = (Instruction *)getaddr_(S,(long)iVar17 << 2);
    f->code = pIVar6;
    f->sizecode = iVar17;
  }
  sVar5 = loadVarint(S,0x7fffffff);
  uVar4 = (uint)sVar5;
  pTVar7 = (TValue *)luaM_malloc_(S->L,(long)(int)uVar4 << 4,0);
  f->k = pTVar7;
  f->sizek = uVar4;
  if (0 < (int)uVar4) {
    uVar15 = (ulong)(uVar4 & 0x7fffffff);
    plVar8 = &pTVar7->tt_;
    do {
      *plVar8 = '\0';
      plVar8 = plVar8 + 0x10;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    if (0 < (int)uVar4) {
      uVar15 = (ulong)(uVar4 & 0x7fffffff);
      lVar16 = 8;
      do {
        pTVar7 = f->k;
        bVar3 = loadByte(S);
        if (bVar3 < 0x11) {
          switch(bVar3) {
          case 0:
            *(undefined1 *)((long)&pTVar7->value_ + lVar16) = 0;
            break;
          case 1:
            *(undefined1 *)((long)&pTVar7->value_ + lVar16) = 1;
            break;
          case 3:
            loadBlock(S,&local_38,8);
            *(undefined8 *)((long)pTVar7 + lVar16 + -8) = local_38;
            *(undefined1 *)((long)&pTVar7->value_ + lVar16) = 3;
            break;
          case 4:
switchD_0011d49e_caseD_4:
            loadString(S,f,&f->source);
            pTVar1 = f->source;
            if (pTVar1 == (TString *)0x0) {
              error(S,"bad format for constant string");
            }
            *(TString **)((long)pTVar7 + lVar16 + -8) = pTVar1;
            *(byte *)((long)&pTVar7->value_ + lVar16) = pTVar1->tt | 0x40;
            f->source = (TString *)0x0;
          }
        }
        else if (bVar3 == 0x11) {
          *(undefined1 *)((long)&pTVar7->value_ + lVar16) = 0x11;
        }
        else if (bVar3 == 0x13) {
          loadBlock(S,&local_38,8);
          *(undefined8 *)((long)pTVar7 + lVar16 + -8) = local_38;
          *(undefined1 *)((long)&pTVar7->value_ + lVar16) = 0x13;
        }
        else if (bVar3 == 0x14) goto switchD_0011d49e_caseD_4;
        lVar16 = lVar16 + 0x10;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
  }
  sVar5 = loadVarint(S,0x7fffffff);
  uVar4 = (uint)sVar5;
  pUVar9 = (Upvaldesc *)luaM_malloc_(S->L,(long)(int)uVar4 << 4,0);
  f->upvalues = pUVar9;
  f->sizeupvalues = uVar4;
  if (0 < (int)uVar4) {
    uVar15 = (ulong)(uVar4 & 0x7fffffff);
    do {
      pUVar9->name = (TString *)0x0;
      pUVar9 = pUVar9 + 1;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    if (0 < (int)uVar4) {
      uVar15 = (ulong)(uVar4 & 0x7fffffff);
      lVar16 = 0;
      do {
        lVar2 = loadByte(S);
        (&f->upvalues->instack)[lVar16] = lVar2;
        lVar2 = loadByte(S);
        (&f->upvalues->idx)[lVar16] = lVar2;
        lVar2 = loadByte(S);
        (&f->upvalues->kind)[lVar16] = lVar2;
        lVar16 = lVar16 + 0x10;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
  }
  sVar5 = loadVarint(S,0x7fffffff);
  uVar4 = (uint)sVar5;
  ppPVar10 = (Proto **)luaM_malloc_(S->L,(long)(int)uVar4 * 8,0);
  f->p = ppPVar10;
  f->sizep = uVar4;
  if (0 < (int)uVar4) {
    uVar15 = 0;
    do {
      f->p[uVar15] = (Proto *)0x0;
      uVar15 = uVar15 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar15);
  }
  if (0 < (int)uVar4) {
    uVar15 = 0;
    do {
      pPVar11 = luaF_newproto(S->L);
      f->p[uVar15] = pPVar11;
      if (((f->marked & 0x20) != 0) && ((f->p[uVar15]->marked & 0x18) != 0)) {
        luaC_barrier_(S->L,(GCObject *)f,(GCObject *)f->p[uVar15]);
      }
      loadFunction(S,f->p[uVar15]);
      uVar15 = uVar15 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar15);
  }
  loadString(S,f,&f->source);
  sVar5 = loadVarint(S,0x7fffffff);
  iVar17 = (int)sVar5;
  if (S->fixed == '\0') {
    plVar12 = (ls_byte *)luaM_malloc_(S->L,(long)iVar17,0);
    f->lineinfo = plVar12;
    f->sizelineinfo = iVar17;
    loadBlock(S,plVar12,(long)iVar17);
  }
  else {
    plVar12 = (ls_byte *)getaddr_(S,(long)iVar17);
    f->lineinfo = plVar12;
    f->sizelineinfo = iVar17;
  }
  sVar5 = loadVarint(S,0x7fffffff);
  iVar17 = (int)sVar5;
  if (0 < iVar17) {
    uVar4 = (uint)S->offset & 3;
    if (uVar4 != 0) {
      loadBlock(S,&local_38,(ulong)(4 - uVar4));
    }
    if (S->fixed == '\0') {
      sVar5 = (sVar5 & 0x7fffffff) << 3;
      pAVar13 = (AbsLineInfo *)luaM_malloc_(S->L,sVar5,0);
      f->abslineinfo = pAVar13;
      f->sizeabslineinfo = iVar17;
      loadBlock(S,pAVar13,sVar5);
    }
    else {
      pAVar13 = (AbsLineInfo *)getaddr_(S,(sVar5 & 0x7fffffff) << 3);
      f->abslineinfo = pAVar13;
      f->sizeabslineinfo = iVar17;
    }
  }
  sVar5 = loadVarint(S,0x7fffffff);
  uVar18 = (uint)sVar5;
  uVar4 = 0;
  pLVar14 = (LocVar *)luaM_malloc_(S->L,(long)(int)uVar18 << 4,0);
  f->locvars = pLVar14;
  f->sizelocvars = uVar18;
  if (0 < (int)uVar18) {
    uVar15 = (ulong)(uVar18 & 0x7fffffff);
    do {
      pLVar14->varname = (TString *)0x0;
      pLVar14 = pLVar14 + 1;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    if (0 < (int)uVar18) {
      uVar15 = (ulong)(uVar18 & 0x7fffffff);
      lVar16 = 0;
      do {
        loadString(S,f,(TString **)((long)&f->locvars->varname + lVar16));
        sVar5 = loadVarint(S,0x7fffffff);
        *(int *)((long)&f->locvars->startpc + lVar16) = (int)sVar5;
        sVar5 = loadVarint(S,0x7fffffff);
        *(int *)((long)&f->locvars->endpc + lVar16) = (int)sVar5;
        lVar16 = lVar16 + 0x10;
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
  }
  sVar5 = loadVarint(S,0x7fffffff);
  if ((int)sVar5 != 0) {
    uVar4 = f->sizeupvalues;
  }
  if (0 < (int)uVar4) {
    lVar16 = 0;
    do {
      loadString(S,f,(TString **)((long)&f->upvalues->name + lVar16));
      lVar16 = lVar16 + 0x10;
    } while ((ulong)uVar4 << 4 != lVar16);
  }
  return;
}

Assistant:

static void loadFunction (LoadState *S, Proto *f) {
  f->linedefined = loadInt(S);
  f->lastlinedefined = loadInt(S);
  f->numparams = loadByte(S);
  f->flag = loadByte(S) & PF_ISVARARG;  /* get only the meaningful flags */
  if (S->fixed)
    f->flag |= PF_FIXED;  /* signal that code is fixed */
  f->maxstacksize = loadByte(S);
  loadCode(S, f);
  loadConstants(S, f);
  loadUpvalues(S, f);
  loadProtos(S, f);
  loadString(S, f, &f->source);
  loadDebug(S, f);
}